

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O1

sljit_s32 sljit_emit_cmov(sljit_compiler *compiler,sljit_s32 type,sljit_s32 dst_reg,sljit_s32 src,
                         sljit_sw srcw)

{
  long lVar1;
  sljit_u8 sVar2;
  sljit_s32 in_EAX;
  uint uVar3;
  sljit_jump *psVar4;
  sljit_jump *psVar5;
  undefined7 extraout_var;
  sljit_u32 features;
  
  if (compiler->error == 0) {
    if (cpu_has_cmov == -1) {
      lVar1 = cpuid_Version_info(1);
      cpu_has_cmov = *(uint *)(lVar1 + 8) >> 0xf & 1;
    }
    if (cpu_has_cmov == 0) {
      psVar4 = sljit_emit_jump(compiler,type ^ 1);
      psVar5 = psVar4;
      if (psVar4 != (sljit_jump *)0x0) {
        uVar3 = sljit_emit_op1(compiler,0x20,dst_reg & 0xfffffeff,0,src,0);
        psVar5 = (sljit_jump *)(ulong)uVar3;
        if ((uVar3 == 0) &&
           (psVar5 = (sljit_jump *)sljit_emit_label(compiler), psVar5 != (sljit_jump *)0x0)) {
          psVar4->flags = (psVar4->flags & 0xfffffffffffffffcU) + 1;
          (psVar4->u).label = (sljit_label *)psVar5;
        }
      }
    }
    else {
      compiler->mode32 = 0;
      psVar4 = (sljit_jump *)emit_x86_instruction(compiler,2,dst_reg & 0xfffffeff,0,src,0);
      psVar5 = psVar4;
      if (psVar4 != (sljit_jump *)0x0) {
        *(undefined1 *)&psVar4->next = 0xf;
        sVar2 = get_jump_code(type & 0xff);
        psVar5 = (sljit_jump *)CONCAT71(extraout_var,sVar2 + 0xc0);
        *(sljit_u8 *)((long)&psVar4->next + 1) = sVar2 + 0xc0;
      }
    }
    in_EAX = (sljit_s32)psVar5;
  }
  return in_EAX;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_cmov(struct sljit_compiler *compiler, sljit_s32 type,
	sljit_s32 dst_reg,
	sljit_s32 src, sljit_sw srcw)
{
	sljit_u8* inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_cmov(compiler, type, dst_reg, src, srcw));

#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
	dst_reg &= ~SLJIT_I32_OP;

	if (!sljit_has_cpu_feature(SLJIT_HAS_CMOV) || (dst_reg >= SLJIT_R3 && dst_reg <= SLJIT_S3))
		return sljit_emit_cmov_generic(compiler, type, dst_reg, src, srcw);
#else
	if (!sljit_has_cpu_feature(SLJIT_HAS_CMOV))
		return sljit_emit_cmov_generic(compiler, type, dst_reg, src, srcw);
#endif

	/* ADJUST_LOCAL_OFFSET is not needed. */
	CHECK_EXTRA_REGS(src, srcw, (void)0);

#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = dst_reg & SLJIT_I32_OP;
	dst_reg &= ~SLJIT_I32_OP;
#endif

	if (SLJIT_UNLIKELY(src & SLJIT_IMM)) {
		EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_IMM, srcw);
		src = TMP_REG1;
		srcw = 0;
	}

	inst = emit_x86_instruction(compiler, 2, dst_reg, 0, src, srcw);
	FAIL_IF(!inst);
	*inst++ = GROUP_0F;
	*inst = get_jump_code(type & 0xff) - 0x40;
	return SLJIT_SUCCESS;
}